

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<LibrarySearchPath>::emplace<LibrarySearchPath_const&>
          (QGenericArrayOps<LibrarySearchPath> *this,qsizetype i,LibrarySearchPath *args)

{
  qsizetype *pqVar1;
  LibrarySearchPath **ppLVar2;
  bool bVar3;
  Data *pDVar4;
  LibrarySearchPath *pLVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  long in_FS_OFFSET;
  bool bVar12;
  Inserter local_b0;
  LibrarySearchPath local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<LibrarySearchPath>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00263a89:
    local_60.super_QMakeLocalFileName.real_name.d.d = (args->super_QMakeLocalFileName).real_name.d.d
    ;
    local_60.super_QMakeLocalFileName.real_name.d.ptr =
         (args->super_QMakeLocalFileName).real_name.d.ptr;
    local_60.super_QMakeLocalFileName.real_name.d.size =
         (args->super_QMakeLocalFileName).real_name.d.size;
    if (&(local_60.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_60.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_)->
      ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((local_60.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_)->ref_).
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_60.super_QMakeLocalFileName.local_name.d.d =
         (args->super_QMakeLocalFileName).local_name.d.d;
    local_60.super_QMakeLocalFileName.local_name.d.ptr =
         (args->super_QMakeLocalFileName).local_name.d.ptr;
    local_60.super_QMakeLocalFileName.local_name.d.size =
         (args->super_QMakeLocalFileName).local_name.d.size;
    if (&(local_60.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData != (QArrayData *)0x0)
    {
      LOCK();
      (((QArrayData *)&((local_60.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_)
      ->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((local_60.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_)->ref_).
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar3 = args->_default;
    local_60._49_7_ = 0xaaaaaaaaaaaaaa;
    local_60._default = bVar3;
    bVar12 = (this->super_QArrayDataPointer<LibrarySearchPath>).size != 0;
    QArrayDataPointer<LibrarySearchPath>::detachAndGrow
              (&this->super_QArrayDataPointer<LibrarySearchPath>,(uint)(i == 0 && bVar12),1,
               (LibrarySearchPath **)0x0,(QArrayDataPointer<LibrarySearchPath> *)0x0);
    qVar11 = local_60.super_QMakeLocalFileName.local_name.d.size;
    pcVar10 = local_60.super_QMakeLocalFileName.local_name.d.ptr;
    pDVar9 = local_60.super_QMakeLocalFileName.local_name.d.d;
    qVar8 = local_60.super_QMakeLocalFileName.real_name.d.size;
    pcVar7 = local_60.super_QMakeLocalFileName.real_name.d.ptr;
    pDVar6 = local_60.super_QMakeLocalFileName.real_name.d.d;
    if (i == 0 && bVar12) {
      pLVar5 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
      local_60.super_QMakeLocalFileName.real_name.d.d = (Data *)0x0;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.d = pDVar6;
      local_60.super_QMakeLocalFileName.real_name.d.ptr = (char16_t *)0x0;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.ptr = pcVar7;
      local_60.super_QMakeLocalFileName.real_name.d.size = 0;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.size = qVar8;
      local_60.super_QMakeLocalFileName.local_name.d.d = (Data *)0x0;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.d = pDVar9;
      local_60.super_QMakeLocalFileName.local_name.d.ptr = (char16_t *)0x0;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.ptr = pcVar10;
      local_60.super_QMakeLocalFileName.local_name.d.size = 0;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.size = qVar11;
      pLVar5[-1]._default = bVar3;
      (this->super_QArrayDataPointer<LibrarySearchPath>).ptr = pLVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<LibrarySearchPath>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_b0.sourceCopyConstruct = 0;
      local_b0.nSource = 0;
      local_b0.move = 0;
      local_b0.sourceCopyAssign = 0;
      local_b0.end = (LibrarySearchPath *)0x0;
      local_b0.last = (LibrarySearchPath *)0x0;
      local_b0.where = (LibrarySearchPath *)0x0;
      local_b0.begin = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
      local_b0.size = (this->super_QArrayDataPointer<LibrarySearchPath>).size;
      local_b0.data = &this->super_QArrayDataPointer<LibrarySearchPath>;
      Inserter::insertOne(&local_b0,i,&local_60);
      (local_b0.data)->ptr = local_b0.begin;
      (local_b0.data)->size = local_b0.size;
      if (&(local_60.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData != (QArrayData *)0x0
         ) {
        LOCK();
        ((local_60.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_60.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate
                    (&(local_60.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_60.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_60.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate
                  (&(local_60.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QArrayDataPointer<LibrarySearchPath>).size == i) &&
       (pLVar5 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pLVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       0x6db6db6db6db6db7)) {
      pDVar6 = (args->super_QMakeLocalFileName).real_name.d.d;
      pLVar5[i].super_QMakeLocalFileName.real_name.d.d = pDVar6;
      pLVar5[i].super_QMakeLocalFileName.real_name.d.ptr =
           (args->super_QMakeLocalFileName).real_name.d.ptr;
      pLVar5[i].super_QMakeLocalFileName.real_name.d.size =
           (args->super_QMakeLocalFileName).real_name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar6->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar6 = (args->super_QMakeLocalFileName).local_name.d.d;
      pLVar5[i].super_QMakeLocalFileName.local_name.d.d = pDVar6;
      pLVar5[i].super_QMakeLocalFileName.local_name.d.ptr =
           (args->super_QMakeLocalFileName).local_name.d.ptr;
      pLVar5[i].super_QMakeLocalFileName.local_name.d.size =
           (args->super_QMakeLocalFileName).local_name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pLVar5[i]._default = args->_default;
    }
    else {
      if ((i != 0) ||
         (pLVar5 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr,
         (LibrarySearchPath *)
         ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pLVar5))
      goto LAB_00263a89;
      pDVar6 = (args->super_QMakeLocalFileName).real_name.d.d;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.d = pDVar6;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.ptr =
           (args->super_QMakeLocalFileName).real_name.d.ptr;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.size =
           (args->super_QMakeLocalFileName).real_name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar6->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar6 = (args->super_QMakeLocalFileName).local_name.d.d;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.d = pDVar6;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.ptr =
           (args->super_QMakeLocalFileName).local_name.d.ptr;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.size =
           (args->super_QMakeLocalFileName).local_name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pLVar5[-1]._default = args->_default;
      ppLVar2 = &(this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
      *ppLVar2 = *ppLVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<LibrarySearchPath>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }